

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O0

bool __thiscall wabt::WastLexer::ReadBlockComment(WastLexer *this)

{
  bool bVar1;
  int iVar2;
  Location local_40;
  int local_1c;
  WastLexer *pWStack_18;
  int nesting;
  WastLexer *this_local;
  
  local_1c = 1;
  pWStack_18 = this;
  do {
    while( true ) {
      while( true ) {
        iVar2 = ReadChar(this);
        if (iVar2 == -1) {
          GetLocation(&local_40,this);
          Error(this,0x35c92a);
          return false;
        }
        if (iVar2 != 10) break;
        Newline(this);
      }
      if (iVar2 != 0x28) break;
      bVar1 = MatchChar(this,';');
      if (bVar1) {
        local_1c = local_1c + 1;
      }
    }
  } while (((iVar2 != 0x3b) || (bVar1 = MatchChar(this,')'), !bVar1)) ||
          (local_1c = local_1c + -1, local_1c != 0));
  return true;
}

Assistant:

bool WastLexer::ReadBlockComment() {
  int nesting = 1;
  while (true) {
    switch (ReadChar()) {
      case kEof:
        ERROR("EOF in block comment");
        return false;

      case ';':
        if (MatchChar(')') && --nesting == 0) {
          return true;
        }
        break;

      case '(':
        if (MatchChar(';')) {
          nesting++;
        }
        break;

      case '\n':
        Newline();
        break;
    }
  }
}